

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

Status __thiscall
google::protobuf::DescriptorPool::SetFeatureSetDefaults
          (DescriptorPool *this,FeatureSetDefaults *spec)

{
  Edition EVar1;
  void *pvVar2;
  undefined1 auVar3 [16];
  undefined8 __p;
  void **ppvVar4;
  const_iterator cVar5;
  Edition EVar6;
  long in_RDX;
  string *this_00;
  AlphaNum *in_R8;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  Edition local_180;
  Edition local_17c;
  string local_178;
  StringifySink local_158;
  StringifySink local_138;
  undefined1 local_118 [48];
  AlphaNum local_e8;
  AlphaNum local_b8;
  AlphaNum local_88;
  undefined1 local_58 [48];
  
  if (*(char *)&spec[1].field_0 == '\x01') {
    message._M_str = (char *)0x49;
    message._M_len = (size_t)this;
    absl::lts_20250127::FailedPreconditionError(message);
  }
  else {
    if (*(int *)(in_RDX + 0x34) < *(int *)(in_RDX + 0x30)) {
      local_118._0_16_ =
           (undefined1  [16])absl::lts_20250127::NullSafeStringView("Invalid edition range ");
      local_17c = *(Edition *)(in_RDX + 0x30);
      local_138.buffer_._M_dataplus._M_p = (pointer)&local_138.buffer_.field_2;
      local_138.buffer_.field_2._M_allocated_capacity = 0;
      local_138.buffer_.field_2._8_8_ = 0;
      local_138.buffer_._M_string_length = 0;
      local_88.piece_ =
           absl::lts_20250127::strings_internal::ExtractStringification<google::protobuf::Edition>
                     (&local_138,&local_17c);
      local_b8.piece_ = absl::lts_20250127::NullSafeStringView(" to ");
      local_180 = *(Edition *)(in_RDX + 0x34);
      local_158.buffer_._M_dataplus._M_p = (pointer)&local_158.buffer_.field_2;
      local_158.buffer_.field_2._M_allocated_capacity = 0;
      local_158.buffer_.field_2._8_8_ = 0;
      local_158.buffer_._M_string_length = 0;
      local_e8.piece_ =
           absl::lts_20250127::strings_internal::ExtractStringification<google::protobuf::Edition>
                     (&local_158,&local_180);
      local_58._0_16_ = (undefined1  [16])absl::lts_20250127::NullSafeStringView(".");
      absl::lts_20250127::StrCat<>
                (&local_178,(AlphaNum *)local_118,&local_88,&local_b8,&local_e8,(AlphaNum *)local_58
                );
      message_00._M_str = (char *)local_178._M_string_length;
      message_00._M_len = (size_t)this;
      absl::lts_20250127::InvalidArgumentError(message_00);
    }
    else {
      ppvVar4 = internal::RepeatedPtrFieldBase::elements((RepeatedPtrFieldBase *)(in_RDX + 0x18));
      cVar5 = RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>::end
                        ((RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>
                          *)(in_RDX + 0x18));
      EVar1 = EDITION_UNKNOWN;
      do {
        EVar6 = EVar1;
        if (ppvVar4 == cVar5.it_) {
          std::
          make_unique<google::protobuf::FeatureSetDefaults,google::protobuf::FeatureSetDefaults>
                    ((FeatureSetDefaults *)local_118);
          __p = local_118._0_8_;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_118._8_8_;
          local_118._0_16_ = auVar3 << 0x40;
          std::
          __uniq_ptr_impl<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
          ::reset((__uniq_ptr_impl<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
                   *)(spec + 2),(pointer)__p);
          std::
          unique_ptr<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
          ::~unique_ptr((unique_ptr<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
                         *)local_118);
          (this->field_memo_table_mutex_).mu_.super___atomic_base<long>._M_i = 1;
          return (Status)(uintptr_t)this;
        }
        pvVar2 = *ppvVar4;
        EVar1 = *(Edition *)((long)pvVar2 + 0x28);
        if (EVar1 == EDITION_UNKNOWN) {
          local_118._0_16_ =
               (undefined1  [16])absl::lts_20250127::NullSafeStringView("Invalid edition ");
          local_178._M_dataplus._M_p._0_4_ = *(undefined4 *)((long)pvVar2 + 0x28);
          local_58._16_8_ = 0;
          local_58[0x18] = '\0';
          local_58[0x19] = '\0';
          local_58[0x1a] = '\0';
          local_58[0x1b] = '\0';
          local_58[0x1c] = '\0';
          local_58[0x1d] = '\0';
          local_58[0x1e] = '\0';
          local_58[0x1f] = '\0';
          local_58._8_8_ = 0;
          local_58._0_8_ = local_58 + 0x10;
          local_88.piece_ =
               absl::lts_20250127::strings_internal::
               ExtractStringification<google::protobuf::Edition>
                         ((StringifySink *)local_58,(Edition *)&local_178);
          local_b8.piece_ = absl::lts_20250127::NullSafeStringView(" specified.");
          absl::lts_20250127::StrCat_abi_cxx11_
                    ((string *)&local_e8,(lts_20250127 *)local_118,&local_88,&local_b8,in_R8);
          message_02._M_str = local_e8.piece_._M_str;
          message_02._M_len = (size_t)this;
          absl::lts_20250127::InvalidArgumentError(message_02);
          std::__cxx11::string::~string((string *)&local_e8);
          this_00 = (string *)local_58;
          goto LAB_001d279b;
        }
        ppvVar4 = ppvVar4 + 1;
      } while ((int)EVar6 < (int)EVar1);
      local_17c = EVar6;
      local_118._0_16_ =
           (undefined1  [16])
           absl::lts_20250127::NullSafeStringView
                     ("Feature set defaults are not strictly increasing.  Edition ");
      local_138.buffer_._M_dataplus._M_p = (pointer)&local_138.buffer_.field_2;
      local_138.buffer_.field_2._M_allocated_capacity = 0;
      local_138.buffer_.field_2._8_8_ = 0;
      local_138.buffer_._M_string_length = 0;
      local_88.piece_ =
           absl::lts_20250127::strings_internal::ExtractStringification<google::protobuf::Edition>
                     (&local_138,&local_17c);
      local_b8.piece_ =
           absl::lts_20250127::NullSafeStringView(" is greater than or equal to edition ");
      local_180 = *(Edition *)((long)pvVar2 + 0x28);
      local_158.buffer_._M_dataplus._M_p = (pointer)&local_158.buffer_.field_2;
      local_158.buffer_.field_2._M_allocated_capacity = 0;
      local_158.buffer_.field_2._8_8_ = 0;
      local_158.buffer_._M_string_length = 0;
      local_e8.piece_ =
           absl::lts_20250127::strings_internal::ExtractStringification<google::protobuf::Edition>
                     (&local_158,&local_180);
      local_58._0_16_ = (undefined1  [16])absl::lts_20250127::NullSafeStringView(".");
      absl::lts_20250127::StrCat<>
                (&local_178,(AlphaNum *)local_118,&local_88,&local_b8,&local_e8,(AlphaNum *)local_58
                );
      message_01._M_str = (char *)local_178._M_string_length;
      message_01._M_len = (size_t)this;
      absl::lts_20250127::InvalidArgumentError(message_01);
    }
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_158);
    this_00 = (string *)&local_138;
LAB_001d279b:
    std::__cxx11::string::~string(this_00);
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status DescriptorPool::SetFeatureSetDefaults(FeatureSetDefaults spec) {
  if (build_started_) {
    return absl::FailedPreconditionError(
        "Feature set defaults can't be changed once the pool has started "
        "building.");
  }
  if (spec.minimum_edition() > spec.maximum_edition()) {
    return absl::InvalidArgumentError(
        absl::StrCat("Invalid edition range ", spec.minimum_edition(), " to ",
                     spec.maximum_edition(), "."));
  }
  Edition prev_edition = EDITION_UNKNOWN;
  for (const auto& edition_default : spec.defaults()) {
    if (edition_default.edition() == EDITION_UNKNOWN) {
      return absl::InvalidArgumentError(absl::StrCat(
          "Invalid edition ", edition_default.edition(), " specified."));
    }
    if (edition_default.edition() <= prev_edition) {
      return absl::InvalidArgumentError(absl::StrCat(
          "Feature set defaults are not strictly increasing.  Edition ",
          prev_edition, " is greater than or equal to edition ",
          edition_default.edition(), "."));
    }
    prev_edition = edition_default.edition();
  }
  feature_set_defaults_spec_ =
      absl::make_unique<FeatureSetDefaults>(std::move(spec));
  return absl::OkStatus();
}